

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTrimmedCurve::~IfcTrimmedCurve(IfcTrimmedCurve *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x9269e8;
  *(undefined8 *)&this->field_0xc8 = 0x926ab0;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x926a10;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x926a38;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       0x926a60;
  *(undefined8 *)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = 0x926a88;
  pcVar1 = (this->MasterRepresentation)._M_dataplus._M_p;
  paVar2 = &(this->MasterRepresentation).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->SenseAgreement)._M_dataplus._M_p;
  paVar2 = &(this->SenseAgreement).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector(&(this->Trim2).
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           );
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector(&(this->Trim1).
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           );
  operator_delete(this,0xe0);
  return;
}

Assistant:

IfcTrimmedCurve() : Object("IfcTrimmedCurve") {}